

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

bool __thiscall
TPZMatrix<std::complex<float>_>::CompareValues
          (TPZMatrix<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *M,
          complex<float> tol)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar6;
  float fVar7;
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  bVar3 = false;
  if ((((M->super_TPZBaseMatrix).fRow == lVar1) &&
      (lVar2 = (this->super_TPZBaseMatrix).fCol, bVar3 = false,
      (M->super_TPZBaseMatrix).fCol == lVar2)) && (bVar3 = lVar1 < 1, 0 < lVar1)) {
    lVar4 = 0;
    do {
      if (0 < lVar2) {
        lVar5 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar4,lVar5);
          (*(M->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(M,lVar4,lVar5);
          fVar6 = cabsf(extraout_XMM0_Da - extraout_XMM0_Da_00);
          fVar7 = cabsf(in_XMM0_Da);
          if (ABS(fVar7) < ABS(fVar6)) {
            return bVar3;
          }
          lVar5 = lVar5 + 1;
        } while (lVar2 != lVar5);
      }
      lVar4 = lVar4 + 1;
      bVar3 = lVar1 <= lVar4;
    } while (lVar4 != lVar1);
  }
  return bVar3;
}

Assistant:

bool TPZMatrix<TVar>::CompareValues(TPZMatrix<TVar> &M, TVar tol){
	
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if ( (M.Rows() != nrows) || (M.Cols() != ncols) ) return false;
	
	REAL diff;
	for( int64_t i = 0; i < nrows; i++)
		for( int64_t j = 0; j < ncols; j++){
            TVar exps = this->Get(i,j) - M.Get(i,j);
			diff = fabs( exps );
			if (diff > fabs(tol)) return false;
		}
	
	return true;
}